

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

void __thiscall ProfileHandler::~ProfileHandler(ProfileHandler *this)

{
  ProfileHandler *this_local;
  
  Reset(this);
  if ((this->per_thread_timer_enabled_ & 1U) != 0) {
    pthread_key_delete(this->thread_timer_key);
  }
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::~list
            (&this->callbacks_);
  return;
}

Assistant:

ProfileHandler::~ProfileHandler() {
  Reset();
#if HAVE_LINUX_SIGEV_THREAD_ID
  if (per_thread_timer_enabled_) {
    pthread_key_delete(thread_timer_key);
  }
#endif
}